

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void CommandLine_Define(KonohaContext *kctx,char *keyvalue,KTraceInfo *trace)

{
  code *pcVar1;
  long lVar2;
  undefined4 uVar3;
  long lVar4;
  undefined4 uVar5;
  undefined1 *puVar6;
  char *pcVar7;
  KTraceInfo *__src;
  char *pcVar8;
  ushort **ppuVar9;
  undefined8 uVar10;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  char *local_60;
  code *local_58;
  undefined4 local_4c;
  long lStack_48;
  ktypeattr_t ty;
  uintptr_t unboxValue;
  undefined1 *puStack_38;
  ksymbol_t key;
  char *namebuf;
  size_t len;
  char *p;
  KTraceInfo *trace_local;
  char *keyvalue_local;
  KonohaContext *kctx_local;
  
  uStack_70 = 0x104d32;
  p = (char *)trace;
  trace_local = (KTraceInfo *)keyvalue;
  keyvalue_local = (char *)kctx;
  len = (size_t)strchr(keyvalue,0x3d);
  __src = trace_local;
  if ((char *)len == (char *)0x0) {
    uStack_70 = 0x104e77;
    fprintf(_stdout,"invalid define option: use -D<key>=<value>\n");
    uStack_70 = 0x104e96;
    (**(code **)(*(long *)(keyvalue_local + 0x10) + 0x90))
              (1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
               ,0x4e);
  }
  else {
    pcVar8 = (char *)(len + -(long)trace_local);
    lVar2 = -((ulong)(pcVar8 + 0x10) & 0xfffffffffffffff0);
    puStack_38 = auStack_68 + lVar2;
    namebuf = pcVar8;
    *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104d7a;
    memcpy(auStack_68 + lVar2,__src,(size_t)pcVar8);
    pcVar7 = keyvalue_local;
    pcVar8 = namebuf;
    puVar6 = puStack_38;
    puStack_38[(long)namebuf] = 0;
    pcVar1 = *(code **)(*(long *)(keyvalue_local + 0x18) + 0x100);
    *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104dab;
    unboxValue._4_4_ = (*pcVar1)(pcVar7,puVar6,pcVar8,0,0xfffffffe);
    *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104db3;
    ppuVar9 = __ctype_b_loc();
    if (((*ppuVar9)[(int)*(char *)(len + 1)] & 0x800) == 0) {
      local_4c = 0;
      lStack_48 = len + 1;
    }
    else {
      local_4c = 4;
      pcVar8 = (char *)(len + 1);
      *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104de9;
      lStack_48 = strtol(pcVar8,(char **)0x0,0);
    }
    pcVar8 = keyvalue_local;
    local_58 = *(code **)(*(long *)(keyvalue_local + 0x18) + 600);
    local_60 = keyvalue_local;
    pcVar1 = *(code **)(*(long *)(keyvalue_local + 0x18) + 0x178);
    uVar10 = *(undefined8 *)(*(long *)(*(long *)(keyvalue_local + 0x20) + 8) + 0x58);
    *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104e42;
    uVar10 = (*pcVar1)(pcVar8,uVar10);
    pcVar7 = p;
    uVar5 = unboxValue._4_4_;
    lVar4 = lStack_48;
    uVar3 = local_4c;
    pcVar1 = local_58;
    pcVar8 = local_60;
    *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x104e5d;
    (*pcVar1)(pcVar8,uVar10,uVar5,uVar3,lVar4,pcVar7);
  }
  return;
}

Assistant:

static void CommandLine_Define(KonohaContext *kctx, char *keyvalue, KTraceInfo *trace)
{
	char *p = strchr(keyvalue, '=');
	if(p != NULL) {
		size_t len = p-keyvalue;
		char *namebuf = ALLOCA(char, len+1);
		memcpy(namebuf, keyvalue, len); namebuf[len] = 0;
//		DBG_P("name='%s'", namebuf);
		ksymbol_t key = KLIB Ksymbol(kctx, namebuf, len, 0, KSymbol_NewId);
		uintptr_t unboxValue;
		ktypeattr_t ty;
		if(isdigit(p[1])) {
			ty = KType_Int;
			unboxValue = (uintptr_t)strtol(p+1, NULL, 0);
		}
		else {
			ty = VirtualType_Text;
			unboxValue = (uintptr_t)(p+1);
		}
		KLIB kNameSpace_SetConstData(kctx, KNULL(NameSpace), key, ty, unboxValue, trace);
	}
	else {
		fprintf(stdout, "invalid define option: use -D<key>=<value>\n");
		KExit(EXIT_FAILURE);
	}
}